

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxmtoau.c
# Opt level: O3

int main(int argc,char **argv)

{
  uint8_t uVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  size_t sVar4;
  char *libxmized;
  size_t k;
  long lVar5;
  xm_context_t *ctx;
  size_t datalen;
  rusage r;
  xm_context_t *local_40d8;
  size_t local_40d0;
  rusage local_40c8;
  float local_4038 [4098];
  
  iVar2 = 1;
  if (argc == 2) {
    __stream = fopen(argv[1],"rb");
    if (__stream == (FILE *)0x0) {
      __assert_fail("fp",
                    "/workspace/llm4binary/github/license_c_cmakelists/Artefact2[P]libxm/examples/libxmtoau.c"
                    ,0x2d,"int main(int, char **)");
    }
    sVar4 = fread(&local_40d0,8,1,__stream);
    if (sVar4 == 0) {
      __assert_fail("fread(&datalen, sizeof(size_t), 1, fp)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Artefact2[P]libxm/examples/libxmtoau.c"
                    ,0x2e,"int main(int, char **)");
    }
    rewind(__stream);
    iVar2 = fileno(__stream);
    libxmized = (char *)mmap((void *)0x0,local_40d0,3,2,iVar2,0);
    if (libxmized == (char *)0xffffffffffffffff) {
      __assert_fail("data != MAP_FAILED",
                    "/workspace/llm4binary/github/license_c_cmakelists/Artefact2[P]libxm/examples/libxmtoau.c"
                    ,0x31,"int main(int, char **)");
    }
    xm_create_context_from_libxmize(&local_40d8,libxmized,48000);
    puts_uint32_be(0x2e736e64);
    puts_uint32_be(0x1c);
    puts_uint32_be(0xffffffff);
    puts_uint32_be(6);
    puts_uint32_be(48000);
    puts_uint32_be(2);
    puts_uint32_be(0);
    uVar1 = xm_get_loop_count(local_40d8);
    if (uVar1 == '\0') {
      do {
        xm_generate_samples(local_40d8,local_4038,0x800);
        lVar5 = 0;
        do {
          puts_uint32_be((uint32_t)local_4038[lVar5]);
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0x1000);
        uVar1 = xm_get_loop_count(local_40d8);
      } while (uVar1 == '\0');
    }
    iVar2 = 0;
    iVar3 = getrusage(RUSAGE_SELF,&local_40c8);
    if (iVar3 != 0) {
      __assert_fail("!getrusage(RUSAGE_SELF, &r)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Artefact2[P]libxm/examples/libxmtoau.c"
                    ,0x4a,"int main(int, char **)");
    }
    fprintf(_stderr,"%s: libxmized length %lu, ru_maxrss %ld\n",*argv,local_40d0,
            local_40c8.ru_maxrss);
    munmap(libxmized,local_40d0);
    fclose(__stream);
  }
  return iVar2;
}

Assistant:

int main(int argc, char** argv) {
	float buffer[buffer_size];
	xm_context_t* ctx;
	void* data;
	size_t datalen;
	FILE* fp;

	if(argc != 2) return 1;

	fp = fopen(argv[1], "rb");
	assert(fp);
	assert(fread(&datalen, sizeof(size_t), 1, fp));
	rewind(fp);
	data = mmap(0, datalen, PROT_READ|PROT_WRITE, MAP_PRIVATE, fileno(fp), 0);
	assert(data != MAP_FAILED);
	xm_create_context_from_libxmize(&ctx, data, rate);

	puts_uint32_be(0x2E736E64); /* .snd magic number */
	puts_uint32_be(28); /* Header size */
	puts_uint32_be((uint32_t)(-1)); /* Data size, unknown */
	puts_uint32_be(6); /* Encoding: 32-bit IEEE floating point */
	puts_uint32_be(rate); /* Sample rate */
	puts_uint32_be(channels); /* Number of interleaved channels */
	puts_uint32_be(0); /* Optional text information */

	while(!xm_get_loop_count(ctx)) {
		xm_generate_samples(ctx, buffer, sizeof(buffer) / (channels * sizeof(float)));
		for(size_t k = 0; k < buffer_size; ++k) {
			union {
				float f;
				uint32_t i;
			} u;

			u.f = buffer[k];
			puts_uint32_be(u.i);
		}
	}

	struct rusage r;
	assert(!getrusage(RUSAGE_SELF, &r));
	fprintf(stderr, "%s: libxmized length %lu, ru_maxrss %ld\n", argv[0], datalen, r.ru_maxrss);

	munmap(data, datalen);
	fclose(fp);
	return 0;
}